

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenSubdir(InMemoryDirectory *this,PathPtr path)

{
  Disposer DVar1;
  long in_RCX;
  undefined8 *__child_stack;
  ReadableDirectory *extraout_RDX;
  char *pcVar2;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  ReadableDirectory *pRVar3;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *subdir;
  void *in_R8;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar4;
  StringPtr name;
  StringPtr name_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_48 [16];
  FsNode local_38;
  Disposer local_30;
  
  __child_stack = (undefined8 *)path.parts.size_;
  name_00.content.ptr =
       (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr;
  if (in_RCX == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48,
               &name_00.content.ptr[1].ptr);
    if (__child_stack[1] == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*__child_stack;
    }
    name.content.size_ = (size_t)pcVar2;
    name.content.ptr = (char *)local_48._8_8_;
    Impl::tryGetEntry((Impl *)&stack0xffffffffffffffc8,name);
    if ((Mutex *)local_38._vptr_FsNode == (Mutex *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      asDirectory(this,name_00.content.ptr,(EntryImpl *)local_48);
    }
    Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48);
    pRVar3 = extraout_RDX_01;
  }
  else if (in_RCX == 0) {
    Directory::clone((Directory *)local_48,(__fn *)name_00.content.ptr,__child_stack,0,in_R8);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)local_48._0_8_;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_48._8_8_;
    local_48._8_8_ = (Impl *)0x0;
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)local_48);
    pRVar3 = extraout_RDX;
  }
  else {
    if (__child_stack[1] == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*__child_stack;
    }
    name_00.content.size_ = (size_t)pcVar2;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc8,name_00);
    DVar1._vptr_Disposer = local_30._vptr_Disposer;
    local_48._0_8_ = local_38._vptr_FsNode;
    local_48._8_8_ = local_30._vptr_Disposer;
    local_30._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    if ((Impl *)DVar1._vptr_Disposer == (Impl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)((long)*DVar1._vptr_Disposer + 0x58))
                (this,DVar1._vptr_Disposer,__child_stack + 3,in_RCX + -1);
    }
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)local_48);
    pRVar3 = extraout_RDX_00;
  }
  MVar4.ptr.ptr = pRVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const override {
    if (path.size() == 0) {
      return clone();
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asDirectory(lock, entry);
      } else {
        return kj::none;
      }
    }